

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAtomicCounterTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::AtomicCounterTest::getCountersValues
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *counterValues,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *values,int ndx,int counterCount)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  long lVar4;
  value_type_conflict4 local_2c;
  
  local_2c = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (counterValues,
             (ulong)((long)(values->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(values->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                           ._M_impl.super__Vector_impl_data._M_start >> 2) /
             (ulong)(long)counterCount,&local_2c);
  puVar1 = (counterValues->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (counterValues->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar3 = (values->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar4 = 0; lVar4 < (int)((ulong)((long)puVar2 - (long)puVar1) >> 2); lVar4 = lVar4 + 1) {
    puVar1[lVar4] = puVar3[ndx];
    ndx = ndx + counterCount;
  }
  return;
}

Assistant:

void AtomicCounterTest::getCountersValues (vector<deUint32>& counterValues, const vector<deUint32>& values, int ndx, int counterCount)
{
	counterValues.resize(values.size()/counterCount, 0);

	DE_ASSERT(values.size() % counterCount == 0);

	for (int valueNdx = 0; valueNdx < (int)counterValues.size(); valueNdx++)
		counterValues[valueNdx] = values[valueNdx * counterCount + ndx];
}